

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRouterById
          (Registry *this,BorderRouterId *aRouterId)

{
  bool bVar1;
  pointer pBVar2;
  pointer pBVar3;
  char cVar4;
  Status SVar5;
  int iVar6;
  pointer pBVar7;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  routers;
  Network brNetwork;
  Network current;
  BorderRouter br;
  BorderRouter pred;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  local_418;
  Network local_3f8;
  Network local_398;
  BorderRouter local_338;
  BorderRouter local_1b0;
  
  BorderRouter::BorderRouter(&local_338);
  Network::Network(&local_398);
  local_418.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BorderRouter::BorderRouter(&local_1b0);
  iVar6 = (*this->mStorage->_vptr_PersistentStorage[0xf])(this->mStorage,aRouterId,&local_338);
  cVar4 = (char)iVar6;
  SVar5 = kNotFound;
  if (cVar4 != '\x01') {
    SVar5 = (cVar4 != '\0') << 2;
  }
  if (cVar4 != '\0') goto LAB_00183280;
  SVar5 = GetCurrentNetwork(this,&local_398);
  if ((SVar5 == kSuccess) && (local_398.mId.mId != 0xffffffff)) {
    Network::Network(&local_3f8);
    iVar6 = (*this->mStorage->_vptr_PersistentStorage[0xf])(this->mStorage,aRouterId,&local_338);
    cVar4 = (char)iVar6;
    SVar5 = kNotFound;
    if (cVar4 != '\x01') {
      SVar5 = (cVar4 != '\0') << 2;
    }
    if (cVar4 == '\0') {
      iVar6 = (*this->mStorage->_vptr_PersistentStorage[0xe])
                        (this->mStorage,&local_338.mNetworkId,&local_3f8);
      cVar4 = (char)iVar6;
      SVar5 = kNotFound;
      if (cVar4 != '\x01') {
        SVar5 = (cVar4 != '\0') << 2;
      }
      if (cVar4 != '\0') goto LAB_00183381;
      if (local_3f8.mXpan == local_398.mXpan) {
        local_1b0.mNetworkId.mId = local_3f8.mId.mId;
        iVar6 = (*this->mStorage->_vptr_PersistentStorage[0x17])
                          (this->mStorage,&local_1b0,&local_418);
        cVar4 = (char)iVar6;
        SVar5 = kNotFound;
        if (cVar4 != '\x01') {
          SVar5 = (cVar4 != '\0') << 2;
        }
        if (cVar4 == '\0') {
          if (1 < (ulong)(((long)local_418.
                                 super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_418.
                                 super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         0x7d6343eb1a1f58d1)) goto LAB_00183557;
          SVar5 = kRestricted;
        }
        goto LAB_00183381;
      }
LAB_00183557:
      bVar1 = true;
      SVar5 = kSuccess;
    }
    else {
LAB_00183381:
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.mMlp._M_dataplus._M_p != &local_3f8.mMlp.field_2) {
      operator_delete(local_3f8.mMlp._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.mName._M_dataplus._M_p != &local_3f8.mName.field_2) {
      operator_delete(local_3f8.mName._M_dataplus._M_p);
    }
    if (!bVar1) goto LAB_00183280;
  }
  iVar6 = (*this->mStorage->_vptr_PersistentStorage[0xb])(this->mStorage,aRouterId);
  pBVar3 = local_418.
           super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = local_418.
           super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  SVar5 = kNotFound;
  if ((char)iVar6 != '\x01') {
    SVar5 = ((char)iVar6 != '\0') << 2;
  }
  if (local_338.mNetworkId.mId != 0xffffffff) {
    pBVar7 = local_418.
             super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_418.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_418.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        (**pBVar7->_vptr_BorderRouter)(pBVar7);
        pBVar7 = pBVar7 + 1;
      } while (pBVar7 != pBVar3);
      local_418.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
    }
    local_1b0.mNetworkId.mId = local_338.mNetworkId.mId;
    iVar6 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,&local_1b0,&local_418);
    SVar5 = ((char)iVar6 != '\0') << 2;
    if ((char)iVar6 == '\x01') {
      Network::Network(&local_3f8);
      iVar6 = (*this->mStorage->_vptr_PersistentStorage[0xe])
                        (this->mStorage,&local_338.mNetworkId,&local_3f8);
      cVar4 = (char)iVar6;
      SVar5 = kNotFound;
      if (cVar4 != '\x01') {
        SVar5 = (cVar4 != '\0') << 2;
      }
      if (cVar4 == '\0') {
        iVar6 = (*this->mStorage->_vptr_PersistentStorage[10])(this->mStorage,&local_338.mNetworkId)
        ;
        cVar4 = (char)iVar6;
        SVar5 = kNotFound;
        if (cVar4 != '\x01') {
          SVar5 = (cVar4 != '\0') << 2;
        }
        if (cVar4 == '\0') {
          SVar5 = DropDomainIfEmpty(this,&local_3f8.mDomainId);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.mMlp._M_dataplus._M_p != &local_3f8.mMlp.field_2) {
        operator_delete(local_3f8.mMlp._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.mName._M_dataplus._M_p != &local_3f8.mName.field_2) {
        operator_delete(local_3f8.mName._M_dataplus._M_p);
      }
    }
  }
LAB_00183280:
  local_1b0._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00291de0;
  BorderAgent::~BorderAgent(&local_1b0.mAgent);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.mMlp._M_dataplus._M_p != &local_398.mMlp.field_2) {
    operator_delete(local_398.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.mName._M_dataplus._M_p != &local_398.mName.field_2) {
    operator_delete(local_398.mName._M_dataplus._M_p);
  }
  local_338._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00291de0;
  BorderAgent::~BorderAgent(&local_338.mAgent);
  return SVar5;
}

Assistant:

Registry::Status Registry::DeleteBorderRouterById(const BorderRouterId &aRouterId)
{
    Registry::Status          status;
    BorderRouter              br;
    Network                   current;
    std::vector<BorderRouter> routers;
    BorderRouter              pred;

    VerifyOrExit((status = MapStatus(mStorage->Get(aRouterId, br))) == Registry::Status::kSuccess);

    status = GetCurrentNetwork(current);
    if (status == Registry::Status::kSuccess && (current.mId.mId != EMPTY_ID))
    {
        Network brNetwork;
        // Check we don't delete the last border router in the current network
        VerifyOrExit((status = MapStatus(mStorage->Get(aRouterId, br))) == Registry::Status::kSuccess);
        VerifyOrExit((status = MapStatus(mStorage->Get(br.mNetworkId, brNetwork))) == Registry::Status::kSuccess);
        if (brNetwork.mXpan == current.mXpan)
        {
            pred.mNetworkId = brNetwork.mId;
            VerifyOrExit((status = MapStatus(mStorage->Lookup(pred, routers))) == Registry::Status::kSuccess);
            VerifyOrExit(routers.size() > 1, status = Registry::Status::kRestricted);
        }
    }

    status = MapStatus(mStorage->Del(aRouterId));

    if (br.mNetworkId.mId != EMPTY_ID)
    {
        // Was it the last in the network?
        routers.clear();
        pred.mNetworkId = br.mNetworkId;
        status          = MapStatus(mStorage->Lookup(pred, routers));
        if (status == Registry::Status::kNotFound)
        {
            Network nwk;
            VerifyOrExit((status = MapStatus(mStorage->Get(br.mNetworkId, nwk))) == Registry::Status::kSuccess);
            VerifyOrExit((status = MapStatus(mStorage->Del(br.mNetworkId))) == Registry::Status::kSuccess);

            VerifyOrExit((status = DropDomainIfEmpty(nwk.mDomainId)) == Registry::Status::kSuccess);
        }
    }
exit:
    return status;
}